

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

RegexPattern * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::CompileProgram<true>
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,Node *root,
          EncodedChar **currentCharacter,CharCount totalLen,CharCount bodyChars,
          CharCount bodyEncodedChars,CharCount totalChars,RegexFlags flags)

{
  ScriptContext *scriptContext;
  ArenaAllocator *ctAllocator;
  StandardChars<char16_t> *standardChars;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  undefined4 *puVar4;
  Recycler *recycler_00;
  Program *program_00;
  size_t sVar5;
  RegexPattern *pattern_00;
  RegexStatsDatabase *pRVar6;
  DebugWriter *this_00;
  ArenaAllocator *rtAllocator_00;
  Char *litbuf;
  ArenaAllocator *rtAllocator;
  DebugWriter *tw;
  RegexStats *stats;
  RegexPattern *pattern;
  Recycler *recycler;
  Program *program;
  CharCount bodyEncodedChars_local;
  CharCount bodyChars_local;
  CharCount totalLen_local;
  EncodedChar **currentCharacter_local;
  Node *root_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0xba5,"(IsLiteral)","IsLiteral");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  recycler_00 = Js::ScriptContext::GetRecycler(this->scriptContext);
  program_00 = Program::New(recycler_00,flags);
  CaptureSourceAndGroups(this,recycler_00,program_00,*currentCharacter,bodyChars,bodyEncodedChars);
  *currentCharacter = *currentCharacter + totalLen;
  sVar5 = GetMultiUnits(this);
  if (sVar5 != totalLen - totalChars) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbb1,"(GetMultiUnits() == totalLen - totalChars)",
                       "GetMultiUnits() == totalLen - totalChars");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pattern_00 = RegexPattern::New(this->scriptContext,program_00,true);
  tw = (DebugWriter *)0x0;
  if ((DAT_01ec73d9 & 1) != 0) {
    pRVar6 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
    tw = (DebugWriter *)RegexStatsDatabase::GetRegexStats(pRVar6,pattern_00);
    pRVar6 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
    RegexStatsDatabase::EndProfile(pRVar6,(RegexStats *)tw,Parse);
  }
  if ((DAT_01ec73d8 & 1) != 0) {
    this_00 = Js::ScriptContext::GetRegexDebugWriter(this->scriptContext);
    DebugWriter::Print(this_00,L"// REGEX COMPILE ");
    RegexPattern::Print(pattern_00,this_00);
    DebugWriter::EOL(this_00);
  }
  if ((DAT_01ec73d9 & 1) != 0) {
    pRVar6 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
    RegexStatsDatabase::BeginProfile(pRVar6);
  }
  rtAllocator_00 = Js::ScriptContext::RegexAllocator(this->scriptContext);
  scriptContext = this->scriptContext;
  ctAllocator = this->ctAllocator;
  standardChars = this->standardChars;
  litbuf = GetLitbuf(this);
  Compiler::Compile(scriptContext,ctAllocator,rtAllocator_00,standardChars,program_00,root,litbuf,
                    pattern_00,this->w,(RegexStats *)tw);
  if ((DAT_01ec73d9 & 1) != 0) {
    pRVar6 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
    RegexStatsDatabase::EndProfile(pRVar6,(RegexStats *)tw,Compile);
  }
  Js::ScriptContext::ProfileEnd(this->scriptContext,RegexCompilePhase);
  uVar3 = RegexPattern::NumGroups(pattern_00);
  if ((uVar3 != 0) && (uVar3 = RegexPattern::NumGroups(pattern_00), uVar3 < 0x8000)) {
    return pattern_00;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0xbe5,"(0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS)",
                     "0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS");
  if (bVar2) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    return pattern_00;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RegexPattern * Parser<P, IsLiteral>::CompileProgram
        ( Node* root,
          const EncodedChar*& currentCharacter,
          const CharCount totalLen,
          const CharCount bodyChars,
          const CharCount bodyEncodedChars,
          const CharCount totalChars,
          const RegexFlags flags )
    {
        Assert(IsLiteral);

        Program* program = nullptr;

        if (buildAST)
        {
            const auto recycler = this->scriptContext->GetRecycler();
            program = Program::New(recycler, flags);
            this->CaptureSourceAndGroups(recycler, program, currentCharacter, bodyChars, bodyEncodedChars);
        }

        currentCharacter += totalLen;
        Assert(GetMultiUnits() == totalLen - totalChars);

        if (!buildAST)
        {
            return nullptr;
        }

        RegexPattern* pattern = RegexPattern::New(this->scriptContext, program, true);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexStats* stats = 0;
        if (REGEX_CONFIG_FLAG(RegexProfile))
        {
            stats = this->scriptContext->GetRegexStatsDatabase()->GetRegexStats(pattern);
            this->scriptContext->GetRegexStatsDatabase()->EndProfile(stats, RegexStats::Parse);
        }
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            DebugWriter* tw = this->scriptContext->GetRegexDebugWriter();
            tw->Print(_u("// REGEX COMPILE "));
            pattern->Print(tw);
            tw->EOL();
        }
        if (REGEX_CONFIG_FLAG(RegexProfile))
            this->scriptContext->GetRegexStatsDatabase()->BeginProfile();
#endif

        ArenaAllocator* rtAllocator = this->scriptContext->RegexAllocator();
        Compiler::Compile
            ( this->scriptContext
              , ctAllocator
              , rtAllocator
              , standardChars
              , program
              , root
              , this->GetLitbuf()
              , pattern
#if ENABLE_REGEX_CONFIG_OPTIONS
              , w
              , stats
#endif
                );

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexProfile))
            this->scriptContext->GetRegexStatsDatabase()->EndProfile(stats, RegexStats::Compile);
#endif

#ifdef PROFILE_EXEC
        this->scriptContext->ProfileEnd(Js::RegexCompilePhase);
#endif
        // CaptureSourceAndGroups throws if this condition doesn't hold.
        Assert(0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS);

        return pattern;
    }